

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.hpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest11::testConfiguration::testConfiguration
          (testConfiguration *this,GLchar *description,GLubyte *expected_color,
          GLuint discard_fragment,GLuint set_global_colors,GLuint sample_texture,GLuint compare,
          GLuint test,GLuint first_sampler,GLuint second_sampler)

{
  GLuint sample_texture_local;
  GLuint set_global_colors_local;
  GLuint discard_fragment_local;
  GLubyte *expected_color_local;
  GLchar *description_local;
  testConfiguration *this_local;
  
  this->m_description = description;
  this->m_expected_color[0] = *expected_color;
  this->m_expected_color[1] = expected_color[1];
  this->m_expected_color[2] = expected_color[2];
  this->m_expected_color[3] = expected_color[3];
  this->m_routines[0] = discard_fragment;
  this->m_routines[1] = set_global_colors;
  this->m_routines[2] = sample_texture;
  this->m_routines[3] = compare;
  this->m_routines[4] = test;
  this->m_samplers[0] = first_sampler;
  this->m_samplers[1] = second_sampler;
  return;
}

Assistant:

testConfiguration(const glw::GLchar* description, const glw::GLubyte expected_color[4],
						  glw::GLuint discard_fragment, glw::GLuint set_global_colors, glw::GLuint sample_texture,
						  glw::GLuint compare, glw::GLuint test, glw::GLuint first_sampler, glw::GLuint second_sampler)
		{
			m_description = description;

			m_expected_color[0] = expected_color[0];
			m_expected_color[1] = expected_color[1];
			m_expected_color[2] = expected_color[2];
			m_expected_color[3] = expected_color[3];

			m_routines[0] = discard_fragment;
			m_routines[1] = set_global_colors;
			m_routines[2] = sample_texture;
			m_routines[3] = compare;
			m_routines[4] = test;

			m_samplers[0] = first_sampler;
			m_samplers[1] = second_sampler;
		}